

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> *
bech32::anon_unknown_0::PreparePolynomialCoefficients
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,string *hrp
          ,data *values)

{
  size_t i;
  ulong uVar1;
  long in_FS_OFFSET;
  byte local_33;
  uchar local_32;
  uchar local_31;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (__return_storage_ptr__,
             (size_type)
             ((values->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish +
             (hrp->_M_string_length * 2 -
             (long)(values->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start) + 7));
  for (uVar1 = 0; uVar1 < hrp->_M_string_length; uVar1 = uVar1 + 1) {
    local_31 = (hrp->_M_dataplus)._M_p[uVar1] >> 5;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,&local_31);
  }
  local_32 = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (__return_storage_ptr__,&local_32);
  for (uVar1 = 0; uVar1 < hrp->_M_string_length; uVar1 = uVar1 + 1) {
    local_33 = (hrp->_M_dataplus)._M_p[uVar1] & 0x1f;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,&local_33);
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
             (const_iterator)
             (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(values->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(values->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<unsigned char> PreparePolynomialCoefficients(const std::string& hrp, const data& values)
{
    data ret;
    ret.reserve(hrp.size() + 1 + hrp.size() + values.size() + CHECKSUM_SIZE);

    /** Expand a HRP for use in checksum computation. */
    for (size_t i = 0; i < hrp.size(); ++i) ret.push_back(hrp[i] >> 5);
    ret.push_back(0);
    for (size_t i = 0; i < hrp.size(); ++i) ret.push_back(hrp[i] & 0x1f);

    ret.insert(ret.end(), values.begin(), values.end());

    return ret;
}